

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void linenoisePrintKeyCodes(void)

{
  undefined7 uVar1;
  undefined8 uVar2;
  undefined4 in_EAX;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auStack_38 [3];
  char c;
  char quit [4];
  
  iVar3 = 0x13ea31;
  puts(
      "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit."
      );
  iVar3 = enableRawMode(iVar3);
  if (iVar3 != -1) {
    _auStack_38 = CONCAT44(0x20202020,in_EAX);
    while( true ) {
      do {
        uVar2 = _auStack_38;
        iVar3 = 0;
        sVar4 = read(0,&c,1);
      } while ((int)sVar4 < 1);
      _auStack_38 = CONCAT24(quit._1_2_,_auStack_38);
      uVar1 = CONCAT16(quit[3],_auStack_38);
      c = SUB81(uVar2,3);
      uVar6 = (uint)c;
      _auStack_38 = CONCAT17(c,uVar1);
      if (quit == (char  [4])0x74697571) break;
      iVar3 = isprint(uVar6);
      uVar5 = (ulong)uVar6;
      if (iVar3 == 0) {
        uVar5 = 0x3f;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",uVar5,(ulong)uVar6,(ulong)uVar6);
      putchar(0xd);
      fflush(_stdout);
    }
    disableRawMode(iVar3);
    return;
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
	char quit[4];

	printf("Linenoise key codes debugging mode.\n"
			   "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
	if (enableRawMode(STDIN_FILENO) == -1) return;
	memset(quit,' ',4);
	while(1) {
		char c;
		int nread;

		nread = read(STDIN_FILENO,&c,1);
		if (nread <= 0) continue;
		memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
		quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
		if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

		printf("'%c' %02x (%d) (type quit to exit)\n",
			   isprint(c) ? c : '?', (int)c, (int)c);
		printf("\r"); /* Go left edge manually, we are in raw mode. */
		fflush(stdout);
	}
	disableRawMode(STDIN_FILENO);
}